

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

void chrono::utils::AddBiSphereGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               double cDist,ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  undefined1 auVar1 [16];
  long lVar2;
  ChFrame<double> frame;
  ChVector<double> v;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_198;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_188;
  undefined1 local_178 [16];
  ChFrame<double> local_160;
  ChFrame<double> local_d8;
  ChVector<double> local_48;
  
  local_d8._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_48.m_data[2] = 0.0;
  local_d8.coord.pos.m_data[2] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_d8.coord.pos.m_data[0] = 0.0;
  local_d8.coord.pos.m_data[1] = 0.0;
  ChFrame<double>::ChFrame(&local_160,&local_48,(ChQuaternion<double> *)&local_d8);
  ChFrame<double>::ChFrame(&local_d8,pos,rot);
  ChFrame<double>::operator=(&local_160,&local_d8);
  if (body != (ChBody *)0x0) {
    lVar2 = __dynamic_cast(body,&ChBody::typeinfo,&ChBodyAuxRef::typeinfo,0);
    if (lVar2 != 0) {
      ChFrame<double>::operator>>(&local_d8,&local_160,(ChFrame<double> *)(lVar2 + 0x360));
      ChFrame<double>::operator=(&local_160,&local_d8);
    }
  }
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_188,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  local_178._8_8_ = 0;
  local_178._0_8_ = cDist * 0.5;
  auVar1 = vunpcklpd_avx(ZEXT816(0),local_178);
  local_d8._vptr_ChFrame = (_func_int **)(auVar1._0_8_ + local_160.coord.pos.m_data[0]);
  local_d8.coord.pos.m_data[0] = auVar1._8_8_ + local_160.coord.pos.m_data[1];
  local_d8.coord.pos.m_data[1] = local_160.coord.pos.m_data[2] + 0.0;
  std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1b8,
             &vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>
            );
  AddSphereGeometry(body,(shared_ptr<chrono::ChMaterialSurface> *)&local_188,radius,
                    (ChVector<double> *)&local_d8,rot,visualization,
                    (shared_ptr<chrono::ChVisualMaterial> *)&local_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_188._M_refcount);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_198,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  local_d8.coord.pos.m_data[0] = local_160.coord.pos.m_data[1] - (double)local_178._0_8_;
  local_d8._vptr_ChFrame = (_func_int **)local_160.coord.pos.m_data[0];
  local_d8.coord.pos.m_data[1] = local_160.coord.pos.m_data[2];
  std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1a8,
             &vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>
            );
  AddSphereGeometry(body,(shared_ptr<chrono::ChMaterialSurface> *)&local_198,radius,
                    (ChVector<double> *)&local_d8,rot,visualization,
                    (shared_ptr<chrono::ChVisualMaterial> *)&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198._M_refcount);
  return;
}

Assistant:

void AddBiSphereGeometry(ChBody* body,
                         std::shared_ptr<ChMaterialSurface> material,
                         double radius,
                         double cDist,
                         const ChVector<>& pos,
                         const ChQuaternion<>& rot,
                         bool visualization,
                         std::shared_ptr<ChVisualMaterial> vis_material) {
    ChFrame<> frame;
    frame = ChFrame<>(pos, rot);
    if (ChBodyAuxRef* body_ar = dynamic_cast<ChBodyAuxRef*>(body)) {
        frame = frame >> body_ar->GetFrame_REF_to_COG();
    }
    const ChVector<>& position = frame.GetPos();

    AddSphereGeometry(body, material, radius, position + ChVector<>(0, 0.5 * cDist, 0), rot, visualization,
                      vis_material);
    AddSphereGeometry(body, material, radius, position - ChVector<>(0, 0.5 * cDist, 0), rot, visualization,
                      vis_material);
}